

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void YuvToBgraRow_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst,int len)

{
  uint8_t *in_RCX;
  int in_R8D;
  __m128i B;
  __m128i G;
  __m128i R;
  int n;
  __m128i kAlpha;
  uint8_t *in_stack_ffffffffffffff48;
  uint8_t in_stack_ffffffffffffff55;
  undefined2 uVar1;
  longlong local_a8 [2];
  longlong local_98 [2];
  __m128i *in_stack_ffffffffffffff78;
  __m128i *in_stack_ffffffffffffff80;
  __m128i *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int iVar2;
  uint8_t *u_00;
  uint8_t *y_00;
  uint8_t *local_50;
  
  uVar1 = 0xff;
  u_00 = (uint8_t *)0xff00ff00ff00ff;
  y_00 = (uint8_t *)0xff00ff00ff00ff;
  local_50 = in_RCX;
  for (iVar2 = 0; iVar2 + 8 <= in_R8D; iVar2 = iVar2 + 8) {
    YUV420ToRGB_SSE2(y_00,u_00,(uint8_t *)CONCAT44(iVar2,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    PackAndStore4_SSE2(&local_a8,&local_98,(__m128i *)&stack0xffffffffffffff78,
                       (__m128i *)&stack0xffffffffffffff98,local_50);
    local_50 = local_50 + 0x20;
  }
  for (; iVar2 < in_R8D; iVar2 = iVar2 + 1) {
    VP8YuvToBgra((uint8_t)((ushort)uVar1 >> 8),(uint8_t)uVar1,in_stack_ffffffffffffff55,
                 in_stack_ffffffffffffff48);
  }
  return;
}

Assistant:

static void YuvToBgraRow_SSE2(const uint8_t* y,
                              const uint8_t* u, const uint8_t* v,
                              uint8_t* dst, int len) {
  const __m128i kAlpha = _mm_set1_epi16(255);
  int n;
  for (n = 0; n + 8 <= len; n += 8, dst += 32) {
    __m128i R, G, B;
    YUV420ToRGB_SSE2(y, u, v, &R, &G, &B);
    PackAndStore4_SSE2(&B, &G, &R, &kAlpha, dst);
    y += 8;
    u += 4;
    v += 4;
  }
  for (; n < len; ++n) {   // Finish off
    VP8YuvToBgra(y[0], u[0], v[0], dst);
    dst += 4;
    y += 1;
    u += (n & 1);
    v += (n & 1);
  }
}